

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::XMLPrinter::PrintString(XMLPrinter *this,char *p,bool restricted)

{
  uint local_5c;
  bool *local_58;
  int local_44;
  int i;
  bool entityPatternPrinted;
  int toPrint;
  size_t delta;
  bool *flag;
  char *q;
  bool *pbStack_18;
  bool restricted_local;
  char *p_local;
  XMLPrinter *this_local;
  
  flag = (bool *)p;
  pbStack_18 = (bool *)p;
  if ((this->_processEntities & 1U) != 0) {
    if (restricted) {
      local_58 = this->_restrictedEntityFlag;
    }
    else {
      local_58 = this->_entityFlag;
    }
    for (; *flag != false; flag = flag + 1) {
      if ((('\0' < *flag) && (*flag < '@')) && ((local_58[*flag] & 1U) != 0)) {
        for (; pbStack_18 < flag; pbStack_18 = pbStack_18 + (int)local_5c) {
          if ((ulong)((long)flag - (long)pbStack_18) < 0x80000000) {
            local_5c = (uint)((long)flag - (long)pbStack_18);
          }
          else {
            local_5c = 0x7fffffff;
          }
          Print(this,"%.*s",(ulong)local_5c,pbStack_18);
        }
        for (local_44 = 0; local_44 < 5; local_44 = local_44 + 1) {
          if ((bool)entities[(long)local_44 * 0x10 + 0xc] == *flag) {
            Print(this,"&%s;",*(undefined8 *)(entities + (long)local_44 * 0x10));
            break;
          }
        }
        pbStack_18 = pbStack_18 + 1;
      }
    }
  }
  if (((this->_processEntities & 1U) == 0) || (pbStack_18 < flag)) {
    Print(this,"%s",pbStack_18);
  }
  return;
}

Assistant:

void XMLPrinter::PrintString( const char* p, bool restricted )
{
    // Look for runs of bytes between entities to print.
    const char* q = p;

    if ( _processEntities ) {
        const bool* flag = restricted ? _restrictedEntityFlag : _entityFlag;
        while ( *q ) {
            TIXMLASSERT( p <= q );
            // Remember, char is sometimes signed. (How many times has that bitten me?)
            if ( *q > 0 && *q < ENTITY_RANGE ) {
                // Check for entities. If one is found, flush
                // the stream up until the entity, write the
                // entity, and keep looking.
                if ( flag[(unsigned char)(*q)] ) {
                    while ( p < q ) {
                        const size_t delta = q - p;
                        // %.*s accepts type int as "precision"
                        const int toPrint = ( INT_MAX < delta ) ? INT_MAX : (int)delta;
                        Print( "%.*s", toPrint, p );
                        p += toPrint;
                    }
                    bool entityPatternPrinted = false;
                    for( int i=0; i<NUM_ENTITIES; ++i ) {
                        if ( entities[i].value == *q ) {
                            Print( "&%s;", entities[i].pattern );
                            entityPatternPrinted = true;
                            break;
                        }
                    }
                    if ( !entityPatternPrinted ) {
                        // TIXMLASSERT( entityPatternPrinted ) causes gcc -Wunused-but-set-variable in release
                        TIXMLASSERT( false );
                    }
                    ++p;
                }
            }
            ++q;
            TIXMLASSERT( p <= q );
        }
    }
    // Flush the remaining string. This will be the entire
    // string if an entity wasn't found.
    TIXMLASSERT( p <= q );
    if ( !_processEntities || ( p < q ) ) {
        Print( "%s", p );
    }
}